

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cubeb_log.cpp
# Opt level: O1

void __thiscall cubeb_async_logger::push(cubeb_async_logger *this,char *str)

{
  size_t __n;
  cubeb_log_message msg;
  cubeb_log_message cStack_118;
  
  __n = strlen(str);
  if (__n < 0x100) {
    memcpy(&cStack_118,str,__n);
    cStack_118.storage[__n] = '\0';
  }
  ring_buffer_base<cubeb_log_message>::enqueue(&this->msg_queue,&cStack_118,1);
  return;
}

Assistant:

void push(char const str[CUBEB_LOG_MESSAGE_MAX_SIZE])
  {
    cubeb_log_message msg(str);
    msg_queue.enqueue(msg);
  }